

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O0

vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_> * __thiscall
slang::ast::Compilation::getDefinitions(Compilation *this)

{
  bool bVar1;
  reference ppSVar2;
  vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_> *in_RDI;
  const_iterator cVar3;
  Symbol *sym;
  const_iterator __end3;
  const_iterator __begin3;
  vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *__range3;
  type *val;
  type *key;
  const_iterator __end2;
  const_iterator __begin2;
  flat_hash_map<std::tuple<std::string_view,_const_Scope_*>,_std::pair<std::vector<Symbol_*>,_bool>_>
  *__range2;
  vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_> *result;
  iterator in_stack_ffffffffffffff28;
  borrowed_iterator_t<std::vector<const_slang::ast::Symbol_*>_&> in_stack_ffffffffffffff30;
  vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_> *pvVar4;
  __normal_iterator<slang::ast::Symbol_*const_*,_std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>_>
  local_78;
  type *local_70;
  type *local_68;
  type *local_60;
  reference local_58;
  value_type *in_stack_ffffffffffffffb8;
  
  pvVar4 = in_RDI;
  std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>::vector
            ((vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_> *)
             0x5e18fe);
  boost::unordered::
  unordered_flat_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
  ::begin((unordered_flat_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
           *)0x5e191e);
  cVar3 = boost::unordered::
          unordered_flat_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
          ::end((unordered_flat_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                 *)0x5e193b);
  while (bVar1 = boost::unordered::detail::foa::operator!=
                           ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                             *)in_stack_ffffffffffffff30._M_current,
                            (table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                             *)in_stack_ffffffffffffff28._M_current), bVar1) {
    local_58 = boost::unordered::detail::foa::
               table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
               ::operator*((table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                            *)in_stack_ffffffffffffff30._M_current);
    local_60 = std::
               get<0ul,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>
                         ((pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>
                           *)0x5e1995);
    local_70 = std::
               get<1ul,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>
                         ((pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>
                           *)0x5e19a7);
    local_68 = local_70;
    local_78._M_current =
         (Symbol **)
         std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>::begin
                   (in_stack_ffffffffffffff28._M_current);
    std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>::end
              ((vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *)
               in_stack_ffffffffffffff28._M_current);
    while (bVar1 = __gnu_cxx::
                   operator==<slang::ast::Symbol_*const_*,_std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>_>
                             ((__normal_iterator<slang::ast::Symbol_*const_*,_std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>_>
                               *)in_stack_ffffffffffffff30._M_current,
                              (__normal_iterator<slang::ast::Symbol_*const_*,_std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>_>
                               *)in_stack_ffffffffffffff28._M_current), ((bVar1 ^ 0xffU) & 1) != 0)
    {
      ppSVar2 = __gnu_cxx::
                __normal_iterator<slang::ast::Symbol_*const_*,_std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>_>
                ::operator*(&local_78);
      in_stack_ffffffffffffff30 =
           std::ranges::__upper_bound_fn::
           operator()<std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_Compilation_cpp:272:52),_std::ranges::less>
                     ((__upper_bound_fn *)&std::ranges::upper_bound,pvVar4,&(*ppSVar2)->name);
      __gnu_cxx::
      __normal_iterator<slang::ast::Symbol_const*const*,std::vector<slang::ast::Symbol_const*,std::allocator<slang::ast::Symbol_const*>>>
      ::__normal_iterator<slang::ast::Symbol_const**>
                ((__normal_iterator<const_slang::ast::Symbol_*const_*,_std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>_>
                  *)in_stack_ffffffffffffff30._M_current,
                 (__normal_iterator<const_slang::ast::Symbol_**,_std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>_>
                  *)in_stack_ffffffffffffff28._M_current);
      in_stack_ffffffffffffff28 =
           std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>::
           insert((vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_> *
                  )cVar3.pc_,(const_iterator)cVar3.p_,in_stack_ffffffffffffffb8);
      __gnu_cxx::
      __normal_iterator<slang::ast::Symbol_*const_*,_std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>_>
      ::operator++(&local_78);
    }
    boost::unordered::detail::foa::
    table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
    ::operator++((table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                  *)in_stack_ffffffffffffff30._M_current);
  }
  return in_RDI;
}

Assistant:

std::vector<const Symbol*> Compilation::getDefinitions() const {
    std::vector<const Symbol*> result;
    for (auto& [key, val] : definitionMap) {
        for (auto sym : val.first) {
            result.insert(std::ranges::upper_bound(result, sym->name, {},
                                                   [](auto item) { return item->name; }),
                          sym);
        }
    }

    return result;
}